

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

void __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
          (basic_socket<asio::ip::tcp,_asio::any_io_executor> *this,io_context *context,
          constraint_t<is_convertible<io_context_&,_execution_context_&>::value> param_2)

{
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&this->impl_,0,0,context);
  return;
}

Assistant:

explicit basic_socket(ExecutionContext& context,
      constraint_t<
        is_convertible<ExecutionContext&, execution_context&>::value
      > = 0)
    : impl_(0, 0, context)
  {
  }